

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

bool testing::internal::ParseGoogleMockStringFlag(char *str,char *flag,string *value)

{
  char *pcVar1;
  char *__s;
  
  __s = ParseGoogleMockFlagValue(str,"verbose",false);
  pcVar1 = DAT_001e9a78;
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace(0x1e9a70,0,pcVar1,(ulong)__s);
  }
  return __s != (char *)0x0;
}

Assistant:

static bool ParseGoogleMockStringFlag(const char* str, const char* flag,
                                      std::string* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseGoogleMockFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  *value = value_str;
  return true;
}